

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_mark(wchar_t x,wchar_t y)

{
  term_win *ptVar1;
  wchar_t *pwVar2;
  int *piVar3;
  wchar_t *pwVar4;
  term *ptVar5;
  
  ptVar5 = Term;
  ptVar1 = Term->old;
  pwVar2 = ptVar1->c[y];
  piVar3 = ptVar1->ta[y];
  pwVar4 = ptVar1->tc[y];
  ptVar1->a[y][x] = 0x80;
  pwVar2[x] = L'\0';
  piVar3[x] = 0x80;
  pwVar4[x] = L'\0';
  if (y < ptVar5->y1) {
    ptVar5->y1 = y;
  }
  if (ptVar5->y2 < y) {
    ptVar5->y2 = y;
  }
  if (x < ptVar5->x1[y]) {
    ptVar5->x1[y] = x;
  }
  if (ptVar5->x2[y] < x) {
    ptVar5->x2[y] = x;
  }
  return 0;
}

Assistant:

errr Term_mark(int x, int y)
{
	int *old_aa = Term->old->a[y];
	wchar_t *old_cc = Term->old->c[y];
	int *old_taa = Term->old->ta[y];
	wchar_t *old_tcc = Term->old->tc[y];

	/*
	 * using 0x80 as the blank attribute and an impossible value for
	 * the blank char is ok since this function is only called by tile
	 * functions, but ideally there should be a test to use the blank text
	 * attr/char pair
	 */
	old_aa[x] = 0x80; 
	old_cc[x] = 0;
	old_taa[x] = 0x80;
	old_tcc[x] = 0;

	/* Update bounds for modified region. */
	if (y < Term->y1) Term->y1 = y;
	if (y > Term->y2) Term->y2 = y;
	if (x < Term->x1[y]) Term->x1[y] = x;
	if (x > Term->x2[y]) Term->x2[y] = x;

	return (0);
}